

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O2

int __thiscall
CTcParser::load_object_file
          (CTcParser *this,CVmFile *fp,textchar_t *fname,tctarg_obj_id_t *obj_xlat,
          tctarg_prop_id_t *prop_xlat,ulong *enum_xlat)

{
  vm_obj_id_t vVar1;
  int iVar2;
  ulong uVar3;
  CTcSymbol **ppCVar4;
  CTcDictEntry **ppCVar5;
  ulong uVar6;
  CTcSymObj *private_owner;
  CTcPrsExport *exp;
  long lVar7;
  bool bVar8;
  
  uVar3 = CVmFile::read_uint4(fp);
  if (uVar3 != 0) {
    ppCVar4 = (CTcSymbol **)malloc(uVar3 << 3);
    this->obj_sym_list_ = ppCVar4;
    this->obj_file_sym_idx_ = 0;
  }
  uVar3 = CVmFile::read_uint4(fp);
  if (uVar3 != 0) {
    ppCVar5 = (CTcDictEntry **)malloc(uVar3 << 3);
    this->obj_dict_list_ = ppCVar5;
    this->obj_file_dict_idx_ = 0;
  }
  uVar3 = CVmFile::read_uint4(fp);
  lVar7 = uVar3 + 1;
  do {
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) {
      uVar3 = CVmFile::read_uint4(fp);
      lVar7 = uVar3 + 1;
      while (lVar7 = lVar7 + -1, lVar7 != 0) {
        iVar2 = CTcSymObjBase::load_from_obj_file(fp,fname,obj_xlat,1);
        if (iVar2 != 0) {
          return 1;
        }
      }
      uVar3 = CVmFile::read_uint4(fp);
      while( true ) {
        uVar6 = CVmFile::read_uint4(fp);
        bVar8 = uVar3 == 0;
        uVar3 = uVar3 - 1;
        if (bVar8) break;
        vVar1 = G_cg->next_obj_;
        G_cg->next_obj_ = vVar1 + 1;
        obj_xlat[uVar6 & 0xffffffff] = vVar1;
      }
      while( true ) {
        uVar3 = CVmFile::read_uint4(fp);
        bVar8 = uVar6 == 0;
        uVar6 = uVar6 - 1;
        if (bVar8) break;
        (*(this->obj_sym_list_[(int)uVar3 - 1]->super_CTcSymbolBase).super_CVmHashEntryCS.
          super_CVmHashEntry._vptr_CVmHashEntry[0xb])
                  (this->obj_sym_list_[(int)uVar3 - 1],fp,fname,obj_xlat,prop_xlat);
      }
      while( true ) {
        uVar6 = CVmFile::read_uint4(fp);
        bVar8 = uVar3 == 0;
        uVar3 = uVar3 - 1;
        if (bVar8) break;
        (*(this->obj_sym_list_[(int)uVar6 - 1]->super_CTcSymbolBase).super_CVmHashEntryCS.
          super_CVmHashEntry._vptr_CVmHashEntry[0xb])
                  (this->obj_sym_list_[(int)uVar6 - 1],fp,fname,obj_xlat,prop_xlat);
      }
      while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
        CTcGramProdEntry::load_from_obj_file(fp,prop_xlat,enum_xlat,(CTcSymObj *)0x0);
      }
      uVar3 = CVmFile::read_uint4(fp);
      while( true ) {
        uVar6 = CVmFile::read_uint4(fp);
        bVar8 = uVar3 == 0;
        uVar3 = uVar3 - 1;
        if (bVar8) break;
        private_owner = get_objfile_objsym(this,(uint)uVar6);
        CTcGramProdEntry::load_from_obj_file(fp,prop_xlat,enum_xlat,private_owner);
      }
      while( true ) {
        bVar8 = uVar6 == 0;
        uVar6 = uVar6 - 1;
        if (bVar8) {
          if (this->obj_sym_list_ != (CTcSymbol **)0x0) {
            free(this->obj_sym_list_);
            this->obj_sym_list_ = (CTcSymbol **)0x0;
          }
          if (this->obj_dict_list_ != (CTcDictEntry **)0x0) {
            free(this->obj_dict_list_);
            this->obj_dict_list_ = (CTcDictEntry **)0x0;
          }
          return 0;
        }
        exp = CTcPrsExport::read_from_obj_file(fp);
        if (exp == (CTcPrsExport *)0x0) break;
        add_export_to_list(this,exp);
      }
      return 1;
    }
    iVar2 = CTcSymbolBase::load_from_obj_file(fp,fname,obj_xlat,prop_xlat,enum_xlat);
  } while (iVar2 == 0);
  return 1;
}

Assistant:

int CTcParser::load_object_file(class CVmFile *fp, const textchar_t *fname,
                                tctarg_obj_id_t *obj_xlat,
                                tctarg_prop_id_t *prop_xlat,
                                ulong *enum_xlat)
{
    ulong sym_cnt;
    ulong dict_cnt;
    ulong i;
    ulong anon_cnt;
    ulong nonsym_cnt;
    ulong prod_cnt;
    ulong exp_cnt;

    /* read the number of symbol index entries */
    sym_cnt = fp->read_uint4();
    if (sym_cnt != 0)
    {
        /* allocate space for the symbol index list */
        obj_sym_list_ = (CTcSymbol **)
                        t3malloc(sym_cnt * sizeof(obj_sym_list_[0]));

        /* the list is empty so far */
        obj_file_sym_idx_ = 0;
    }

    /* read the number of dictionary symbols */
    dict_cnt = fp->read_uint4();

    /* if there are any symbols, read them */
    if (dict_cnt != 0)
    {
        /* allocate space for the dictionary index list */
        obj_dict_list_ = (CTcDictEntry **)
                         t3malloc(dict_cnt * sizeof(obj_dict_list_[0]));

        /* nothing in the list yet */
        obj_file_dict_idx_ = 0;
    }

    /* read the number of symbols in the file */
    sym_cnt = fp->read_uint4();

    /* read the symbols */
    for (i = 0 ; i < sym_cnt ; ++i)
    {
        /* load a symbol */
        if (CTcSymbol::load_from_obj_file(fp, fname,
                                          obj_xlat, prop_xlat, enum_xlat))
            return 1;
    }

    /* read the number of anonymous object symbols */
    anon_cnt = fp->read_uint4();

    /* read the anonymous object symbols */
    for (i = 0 ; i < anon_cnt ; ++i)
    {
        /* load the next anonymous object symbol */
        if (CTcSymObj::load_from_obj_file(fp, fname, obj_xlat, TRUE))
            return 1;
    }

    /* read the non-symbol object ID's */
    nonsym_cnt = fp->read_uint4();
    for (i = 0 ; i < nonsym_cnt ; ++i)
    {
        tctarg_obj_id_t id;

        /* read the next non-symbol object ID */
        id = (tctarg_obj_id_t)fp->read_uint4();

        /* 
         *   allocate a new ID for the object, and set the translation
         *   table for the new ID - this will ensure that references to
         *   this non-symbol object are properly fixed up 
         */
        obj_xlat[id] = G_cg->new_obj_id();
    }

    /* read the number of symbol cross-reference sections in the file */
    sym_cnt = fp->read_uint4();

    /* read the symbol cross-references */
    for (i = 0 ; i < sym_cnt ; ++i)
    {
        ulong idx;
        CTcSymbol *sym;

        /* read the symbol index */
        idx = fp->read_uint4();

        /* get the symbol from the index list */
        sym = get_objfile_sym(idx);

        /* load the symbol's reference information */
        sym->load_refs_from_obj_file(fp, fname, obj_xlat, prop_xlat);
    }

    /* read the number of anonymous object cross-references */
    anon_cnt = fp->read_uint4();

    /* read the anonymous object cross-references */
    for (i = 0 ; i < anon_cnt ; ++i)
    {
        ulong idx;
        CTcSymbol *sym;

        /* read the symbol index */
        idx = fp->read_uint4();

        /* get the symbol from the index list */
        sym = get_objfile_sym(idx);

        /* load the symbol's reference information */
        sym->load_refs_from_obj_file(fp, fname, obj_xlat, prop_xlat);
    }

    /* read the master grammar rule count */
    prod_cnt = fp->read_uint4();

    /* read the master grammar rule list */
    for (i = 0 ; i < prod_cnt ; ++i)
    {
        /* read the next grammar production */
        CTcGramProdEntry::load_from_obj_file(fp, prop_xlat, enum_xlat, 0);
    }

    /* read the number of named grammar rules */
    prod_cnt = fp->read_uint4();

    /* read the private grammar rules */
    for (i = 0 ; i < prod_cnt ; ++i)
    {
        CTcSymObj *match_sym;

        /* read the match object defining the rule */
        match_sym = get_objfile_objsym(fp->read_uint4());

        /* read the private rule list */
        CTcGramProdEntry::load_from_obj_file(
            fp, prop_xlat, enum_xlat, match_sym);
    }

    /* read the export symbol list */
    exp_cnt = fp->read_uint4();
    for (i = 0 ; i < exp_cnt ; ++i)
    {
        CTcPrsExport *exp;
        
        /* read the next entry */
        exp = CTcPrsExport::read_from_obj_file(fp);

        /* if that failed, the whole load fails */
        if (exp == 0)
            return 1;

        /* add it to our list */
        add_export_to_list(exp);
    }

    /* done with the symbol index list - free it */
    if (obj_sym_list_ != 0)
    {
        /* free it and forget it */
        t3free(obj_sym_list_);
        obj_sym_list_ = 0;
    }

    /* done with the dictionary index list - free it */
    if (obj_dict_list_ != 0)
    {
        /* free the memory and forget it */
        t3free(obj_dict_list_);
        obj_dict_list_ = 0;
    }

    /* success */
    return 0;
}